

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O3

void rhash_sha1_final(sha1_ctx *ctx,uchar *result)

{
  uint64_t uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar1 = ctx->length;
  uVar6 = (uint)uVar1;
  uVar5 = uVar6 & 0x3f;
  ctx->message[uVar5] = 0x80;
  uVar7 = uVar5 + 1;
  uVar3 = uVar7;
  if ((uVar7 & 3) != 0) {
    memset(ctx->message + (ulong)(uVar6 & 0x3f) + 1,0,(ulong)(2 - uVar6 & 3) + 1);
    uVar3 = ((byte)(2 - (char)uVar1) & 3) + uVar5 + 2;
    do {
      uVar7 = uVar7 + 1;
    } while ((uVar7 & 3) != 0);
  }
  if (uVar3 < 0x39) {
    if (uVar3 == 0x38) goto LAB_007d4606;
    uVar3 = uVar3 >> 2;
  }
  else {
    if (uVar3 < 0x40) {
      ctx->message[0x3c] = '\0';
      ctx->message[0x3d] = '\0';
      ctx->message[0x3e] = '\0';
      ctx->message[0x3f] = '\0';
    }
    rhash_sha1_process_block(ctx->hash,(uint *)ctx);
    uVar3 = 0;
  }
  memset(ctx->message + uVar3 * 4,0,(ulong)(uVar3 * -4 + 0x34) + 4);
LAB_007d4606:
  uVar2 = ctx->length;
  uVar3 = (uint)(uVar2 >> 0x1d);
  *(uint *)(ctx->message + 0x38) =
       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  iVar4 = (int)uVar2;
  uVar3 = iVar4 << 3;
  *(uint *)(ctx->message + 0x3c) =
       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | iVar4 << 0x1b;
  rhash_sha1_process_block(ctx->hash,(uint *)ctx);
  if (result == (uchar *)0x0) {
    return;
  }
  rhash_swap_copy_str_to_u32(result,0,ctx->hash,0x14);
  return;
}

Assistant:

void rhash_sha1_final(sha1_ctx* ctx, unsigned char* result)
{
	unsigned  index = (unsigned)ctx->length & 63;
	unsigned* msg32 = (unsigned*)ctx->message;

	/* pad message and run for last block */
	ctx->message[index++] = 0x80;
	while ((index & 3) != 0) {
		ctx->message[index++] = 0;
	}
	index >>= 2;

	/* if no room left in the message to store 64-bit message length */
	if (index > 14) {
		/* then fill the rest with zeros and process it */
		while (index < 16) {
			msg32[index++] = 0;
		}
		rhash_sha1_process_block(ctx->hash, msg32);
		index = 0;
	}
	while (index < 14) {
		msg32[index++] = 0;
	}
	msg32[14] = be2me_32( (unsigned)(ctx->length >> 29) );
	msg32[15] = be2me_32( (unsigned)(ctx->length << 3) );
	rhash_sha1_process_block(ctx->hash, msg32);

	if (result) be32_copy(result, 0, &ctx->hash, sha1_hash_size);
}